

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

int float_down(long hmask,long emask)

{
  boolean bVar1;
  boolean bVar2;
  int n;
  uint uVar3;
  char *pcVar4;
  trap *trap;
  xchar ox;
  char *pcVar5;
  xchar oy;
  bool bVar6;
  d_level current_dungeon_level;
  
  u.uprops[0x12].intrinsic = ~(uint)hmask & u.uprops[0x12].intrinsic;
  u.uprops[0x12].extrinsic = ~(uint)emask & u.uprops[0x12].extrinsic;
  if (u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) {
    return 0;
  }
  if ((youmonst.data)->mlet == '\x05') {
    return 0;
  }
  if ((u._1052_1_ & 1) != 0) {
    pcVar4 = "You feel less buoyant, but you are still %s.";
    if ((u.uprops[0x3c].extrinsic == 0) && (((youmonst.data)->mflags1 & 1) == 0)) {
      if (u.usteed == (monst *)0x0) {
        pcVar4 = "You float down, but you are still %s.";
      }
      else {
        pcVar4 = "You feel less buoyant, but you are still %s.";
        if (((u.usteed)->data->mflags1 & 1) == 0) {
          pcVar4 = "You float down, but you are still %s.";
        }
      }
    }
    pcVar5 = "while swallowed";
    if (((u.ustuck)->data->mflags1 >> 0x12 & 1) == 0) {
      pcVar5 = "while engulfed";
    }
    pline(pcVar4,pcVar5 + 6);
    return 1;
  }
  if ((uball == (obj *)0x0) || (uball->where == '\x03')) {
LAB_00257137:
    trap = (trap *)0x0;
  }
  else {
    bVar1 = is_pool(level,(int)uball->ox,(int)uball->oy);
    if (bVar1 == '\0') {
      ox = uball->ox;
      oy = uball->oy;
      trap = t_at(level,(int)ox,(int)oy);
      if (trap == (trap *)0x0) goto LAB_00257137;
      if ((byte)((trap->field_0x8 & 0x1f) - 0xb) < 4) goto LAB_002571ba;
    }
    else {
      ox = uball->ox;
      oy = uball->oy;
      trap = (trap *)0x0;
LAB_002571ba:
      u.ux0 = u.ux;
      u.uy0 = u.uy;
      u.uy = oy;
      u.ux = ox;
      movobj(uchain,ox,oy);
      newsym((int)u.ux0,(int)u.uy0);
      vision_full_recalc = '\x01';
    }
  }
  if (((u.uprops[0x3c].extrinsic == 0) && (((youmonst.data)->mflags1 & 1) == 0)) &&
     ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))) {
    if (((u._1052_1_ & 1) == 0) && (u.ustuck != (monst *)0x0)) {
      bVar1 = sticks(youmonst.data);
      pcVar4 = mon_nam(u.ustuck);
      pcVar5 = "You aren\'t able to maintain your hold on %s.";
      if (bVar1 == '\0') {
        pcVar5 = "Startled, %s can no longer hold you!";
      }
      pline(pcVar5,pcVar4);
      u.ustuck = (monst *)0x0;
      u._1052_1_ = u._1052_1_ & 0x7f;
    }
    bVar1 = is_pool(level,(int)u.ux,(int)u.uy);
    if (bVar1 == '\0') {
LAB_00257612:
      bVar1 = '\0';
    }
    else {
      if (u.uprops[0x27].extrinsic == 0) {
        if (u.uprops[0x39].intrinsic == 0) goto LAB_002575d2;
        goto LAB_00257612;
      }
      bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
      bVar1 = '\0';
      if ((bVar2 != '\0') && (u.uprops[0x39].intrinsic == 0)) {
LAB_002575d2:
        if (((u.uprops[0x39].extrinsic != 0) || (((youmonst.data)->mflags1 & 2) != 0)) ||
           (((u.usteed != (monst *)0x0 && (((u.usteed)->data->mflags1 & 2) != 0)) ||
            ((u._1052_1_ & 2) != 0)))) goto LAB_00257612;
        bVar1 = drown();
      }
    }
    bVar2 = is_lava(level,(int)u.ux,(int)u.uy);
    if (bVar2 != '\0') {
      lava_effects();
      bVar1 = '\x01';
    }
    bVar2 = is_swamp(level,(int)u.ux,(int)u.uy);
    if (bVar2 != '\0') {
      swamp_effects();
      bVar1 = '\x01';
    }
  }
  else {
    bVar1 = '\0';
  }
  if (trap == (trap *)0x0) {
    trap = t_at(level,(int)u.ux,(int)u.uy);
    bVar2 = on_level(&u.uz,&dungeon_topology.d_air_level);
    if (bVar2 == '\0') {
      bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
      if (bVar1 == '\0' && bVar2 != '\0') {
        pcVar4 = "You feel heavier.";
        goto LAB_002574f1;
      }
      if (((((uint)emask >> 0x14 & 1) == 0) && ((u._1052_1_ & 2) == 0)) && (bVar1 == '\0')) {
        bVar6 = u.uz.dnum != dungeon_topology.d_sokoban_dnum;
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
          if (trap == (trap *)0x0 || bVar6) {
            if (((u.uprops[0x3c].extrinsic == 0) && (((youmonst.data)->mflags1 & 1) == 0)) &&
               ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))) {
              surface((int)u.ux,(int)u.uy);
              pcVar4 = "You float gently to the %s.";
              goto LAB_0025769e;
            }
            pline("You feel less buoyant.");
          }
          else {
            pline("You fall over.");
            n = rnd(2);
            losehp(n,"dangerous winds",1);
            if (u.usteed != (monst *)0x0) {
              dismount_steed(1);
            }
            selftouch("As you fall, you");
          }
        }
        else {
          is_pool(level,(int)u.ux,(int)u.uy);
          pcVar4 = "Bummer!  You\'ve %s.";
LAB_0025769e:
          pline(pcVar4);
        }
      }
    }
    else {
      if (((u.uprops[0x3c].extrinsic == 0) && (((youmonst.data)->mflags1 & 1) == 0)) &&
         ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))) {
        pcVar4 = "You begin to tumble in place.";
      }
      else {
        pcVar4 = "You feel less buoyant.";
      }
LAB_002574f1:
      pline(pcVar4);
    }
    nomul(0,(char *)0x0);
  }
  assign_level(&current_dungeon_level,&u.uz);
  if (trap != (trap *)0x0) {
    uVar3 = (byte)trap->field_0x8 & 0x1f;
    if (uVar3 - 0xd < 2) {
      bVar1 = can_fall_thru(level);
      if ((bVar1 == '\0') || (u.ustuck != (monst *)0x0)) goto LAB_00257563;
    }
    else if (uVar3 == 0x14) goto LAB_00257563;
    if (u.utrap == 0) {
      dotrap(trap,0);
    }
  }
LAB_00257563:
  bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level);
  if ((((bVar1 == '\0') && (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0'))
      && ((u._1052_1_ & 1) == 0)) && (bVar1 = on_level(&u.uz,&current_dungeon_level), bVar1 != '\0')
     ) {
    pickup(1);
  }
  return 1;
}

Assistant:

int float_down(long hmask, long emask)     /* might cancel timeout */
{
	struct trap *trap = NULL;
	d_level current_dungeon_level;
	boolean no_msg = FALSE;

	HLevitation &= ~hmask;
	ELevitation &= ~emask;
	if (Levitation) return 0; /* maybe another ring/potion/boots */
	if (u.uswallow) {
	    pline((Flying) ? "You feel less buoyant, but you are still %s." :
	                     "You float down, but you are still %s.",
		is_animal(u.ustuck->data) ? "swallowed" : "engulfed");
	    return 1;
	}

	if (Punished && !carried(uball) &&
	    (is_pool(level, uball->ox, uball->oy) ||
	     ((trap = t_at(level, uball->ox, uball->oy)) &&
	      ((trap->ttyp == PIT) || (trap->ttyp == SPIKED_PIT) ||
	       (trap->ttyp == TRAPDOOR) || (trap->ttyp == HOLE))))) {
			u.ux0 = u.ux;
			u.uy0 = u.uy;
			u.ux = uball->ox;
			u.uy = uball->oy;
			movobj(uchain, uball->ox, uball->oy);
			newsym(u.ux0, u.uy0);
			vision_full_recalc = 1;	/* in case the hero moved. */
	}
	/* check for falling into pool - added by GAN 10/20/86 */
	if (!Flying) {
		if (!u.uswallow && u.ustuck) {
			if (sticks(youmonst.data))
				pline("You aren't able to maintain your hold on %s.",
					mon_nam(u.ustuck));
			else
				pline("Startled, %s can no longer hold you!",
					mon_nam(u.ustuck));
			u.ustuck = 0;
			u.uwilldrown = 0;
		}
		/* kludge alert:
		 * drown() and lava_effects() print various messages almost
		 * every time they're called which conflict with the "fall
		 * into" message below.  Thus, we want to avoid printing
		 * confusing, duplicate or out-of-order messages.
		 * Use knowledge of the two routines as a hack -- this
		 * should really be handled differently -dlc
		 */
		if (is_pool(level, u.ux,u.uy) && !Wwalking && !Swimming && !u.uinwater)
			no_msg = drown();
		if (is_lava(level, u.ux,u.uy)) {
			lava_effects();
			no_msg = TRUE;
		}
		if (is_swamp(level, u.ux,u.uy)) {
			swamp_effects();
			no_msg = TRUE;
		}
	}
	if (!trap) {
	    trap = t_at(level, u.ux,u.uy);
	    if (Is_airlevel(&u.uz)) {
		if (Flying)
		    pline("You feel less buoyant.");
		else
		    pline("You begin to tumble in place.");
	    } else if (Is_waterlevel(&u.uz) && !no_msg)
		pline("You feel heavier.");
	    /* u.uinwater msgs already in spoteffects()/drown() */
	    else if (!u.uinwater && !no_msg) {
		if (!(emask & W_SADDLE))
		{
		    boolean sokoban_trap = (In_sokoban(&u.uz) && trap);
		    if (Hallucination)
			pline("Bummer!  You've %s.",
			      is_pool(level, u.ux,u.uy) ?
			      "splashed down" : sokoban_trap ? "crashed" :
			      "hit the ground");
		    else {
			if (!sokoban_trap) {
			    if (Flying)
				pline("You feel less buoyant.");
			    else
				pline("You float gently to the %s.",
				      surface(u.ux, u.uy));
			} else {
			    /* Justification elsewhere for Sokoban traps
			     * is based on air currents. This is
			     * consistent with that.
			     * The unexpected additional force of the
			     * air currents once leviation
			     * ceases knocks you off your feet.
			     */
			    pline("You fall over.");
			    losehp(rnd(2), "dangerous winds", KILLED_BY);
			    if (u.usteed) dismount_steed(DISMOUNT_FELL);
			    selftouch("As you fall, you");
			}
		    }
		}
	    }
	    nomul(0, NULL);
	}

	/* can't rely on u.uz0 for detecting trap door-induced level change;
	   it gets changed to reflect the new level before we can check it */
	assign_level(&current_dungeon_level, &u.uz);

	if (trap)
		switch(trap->ttyp) {
		case STATUE_TRAP:
			break;
		case HOLE:
		case TRAPDOOR:
			if (!can_fall_thru(level) || u.ustuck)
				break;
			/* fall into next case */
		default:
			if (!u.utrap) /* not already in the trap */
				dotrap(trap, 0);
	}

	if (!Is_airlevel(&u.uz) && !Is_waterlevel(&u.uz) && !u.uswallow &&
		/* falling through trap door calls goto_level,
		   and goto_level does its own pickup() call */
		on_level(&u.uz, &current_dungeon_level))
	    pickup(1);
	return 1;
}